

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

int TPZShapeHCurlNoGrads<pzshape::TPZShapeLinear>::ComputeNConnectShapeF(int icon,int order)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (order != 0) {
    iVar2 = 1;
    iVar1 = pztopology::TPZLine::NumSides(1);
    if (iVar1 <= icon) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "auto TPZShapeHCurlNoGrads<pzshape::TPZShapeLinear>::ComputeNConnectShapeF(const int, const int)::(anonymous class)::operator()() const [TSHAPE = pzshape::TPZShapeLinear]"
                 ,0xa9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error.",7);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHCurlNoGrads.cpp"
                 ,0x96);
    }
  }
  return iVar2;
}

Assistant:

int TPZShapeHCurlNoGrads<TSHAPE>::ComputeNConnectShapeF(const int icon, const int order)

{
    constexpr int nNodes = TSHAPE::NCornerNodes;
    const int side = icon + nNodes;
#ifdef PZDEBUG
    if (side < nNodes || side >= TSHAPE::NSides) {
        DebugStop();
    }
#endif
    //given the choice of implementation, there are no shape functions for k=0
    if(order == 0) return 0;
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    const int nShapeF = [&](){
        if (side < nNodes + nEdges) {//edge connect
          return 1;
        }
        else if(side < nNodes + nEdges + nFaces){//face connect
            switch(TSHAPE::Type(side)){
            case ETriangle://triangular face
              return (order - 1) * (order+2)/2;
            case EQuadrilateral://quadrilateral face
              // 2k(k+1)- k^2
              return order*(order+2);
            default:
              PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
              DebugStop();
              return 0;
            }
        }
        else{//internal connect (3D element only)
            if constexpr (TSHAPE::Type() == ETetraedro){
                return (order-1)*(order-2)*(2*order+3)/6;
            } else if constexpr (TSHAPE::Type() == ECube){
                return order*order*(2*order+3);
            }
            else if constexpr (TSHAPE::Type() == ECube){
              return order*order*(2*order+3);
            }
            else{
                PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
                DebugStop();
                return 0;
            }
        }
    }();
    return nShapeF;
 }